

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TStdExtension.cpp
# Opt level: O1

void __thiscall StdOutbound_Test1_Test::TestBody(StdOutbound_Test1_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  undefined8 *puVar3;
  size_type sVar4;
  streamsize __num;
  char *pcVar5;
  char *in_R9;
  bool bVar6;
  AssertionResult gtest_ar_;
  char *outFileName;
  string s;
  ifstream ifs2;
  ofstream ofs;
  ifstream ifs;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_678;
  AssertHelper local_670;
  undefined8 *puStack_668;
  AssertHelper local_660;
  char *local_658;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_650;
  string local_630 [7];
  undefined8 auStack_548 [36];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_428;
  filebuf local_420 [24];
  byte abStack_408 [200];
  long alStack_340 [2];
  ios_base local_330 [264];
  long local_228 [29];
  undefined8 auStack_140 [36];
  
  std::ifstream::ifstream(local_228,"../test/testdata/StdExtension.data",_S_in);
  paVar1 = &local_650.field_2;
  local_650._M_string_length = 0;
  local_650.field_2._M_local_buf[0] = '\0';
  local_630[0]._M_dataplus._M_p = (char *)0x0;
  local_630[0]._M_string_length._0_4_ = 0xffffffff;
  local_650._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_650,paVar1,paVar1,
             *(undefined8 *)((long)auStack_140 + *(long *)(local_228[0] + -0x18)),0xffffffff);
  testing::internal::CmpHelperEQ<char[41],std::__cxx11::string>
            ((internal *)local_630,"\"key1 = val1\\n##this is comment\\nkey2=val2\\n\"","s",
             (char (*) [41])"key1 = val1\n##this is comment\nkey2=val2\n",&local_650);
  if ((char)local_630[0]._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_428);
    if ((undefined8 *)
        CONCAT44(local_630[0]._M_string_length._4_4_,(undefined4)local_630[0]._M_string_length) ==
        (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)CONCAT44(local_630[0]._M_string_length._4_4_,
                                  (undefined4)local_630[0]._M_string_length);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_670,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
               ,0xc,pcVar5);
    testing::internal::AssertHelper::operator=(&local_670,(Message *)&local_428);
    testing::internal::AssertHelper::~AssertHelper(&local_670);
    if (local_428._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_428._M_head_impl + 8))();
    }
    puVar3 = (undefined8 *)
             CONCAT44(local_630[0]._M_string_length._4_4_,(undefined4)local_630[0]._M_string_length)
    ;
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
  }
  else {
    puVar3 = (undefined8 *)
             CONCAT44(local_630[0]._M_string_length._4_4_,(undefined4)local_630[0]._M_string_length)
    ;
    if (puVar3 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar3 != puVar3 + 2) {
        operator_delete((undefined8 *)*puVar3);
      }
      operator_delete(puVar3);
    }
    local_658 = "stdoutbuond.test.tmp";
    std::ofstream::ofstream(&local_428,"stdoutbuond.test.tmp",_S_out);
    sVar4 = local_650._M_string_length;
    pcVar5 = local_658;
    strlen(local_658);
    std::__cxx11::string::_M_replace((ulong)&local_650,0,(char *)sVar4,(ulong)pcVar5);
    if ((0 < (long)local_650._M_string_length) &&
       (plVar2 = *(long **)((long)alStack_340 + *(long *)(local_428._M_head_impl + -0x18)),
       plVar2 != (long *)0x0)) {
      (**(code **)(*plVar2 + 0x60))(plVar2,local_650._M_dataplus._M_p);
    }
    bVar6 = (abStack_408[*(long *)(local_428._M_head_impl + -0x18)] & 5) == 0;
    local_670.data_._0_1_ = (internal)bVar6;
    puStack_668 = (undefined8 *)0x0;
    if (bVar6) {
      std::ofstream::close();
      std::ifstream::ifstream(local_630,local_658,_S_in);
      local_670.data_ = (AssertHelperData *)0x0;
      puStack_668 = (undefined8 *)CONCAT44(puStack_668._4_4_,0xffffffff);
      std::__cxx11::string::
      _M_replace_dispatch<std::istreambuf_iterator<char,std::char_traits<char>>>
                ((string *)&local_650,local_650._M_dataplus._M_p,
                 (char *)(local_650._M_string_length + (long)local_650._M_dataplus._M_p),
                 *(undefined8 *)
                  ((long)auStack_548 + *(long *)(local_630[0]._M_dataplus._M_p + -0x18)),0xffffffff)
      ;
      testing::internal::CmpHelperEQ<char_const*,std::__cxx11::string>
                ((internal *)&local_670,"outFileName","s",&local_658,&local_650);
      if (local_670.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_678);
        if (puStack_668 == (undefined8 *)0x0) {
          pcVar5 = "";
        }
        else {
          pcVar5 = (char *)*puStack_668;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_660,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
                   ,0x17,pcVar5);
        testing::internal::AssertHelper::operator=(&local_660,(Message *)&local_678);
        testing::internal::AssertHelper::~AssertHelper(&local_660);
        if (local_678._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_678._M_head_impl + 8))();
        }
      }
      puVar3 = puStack_668;
      if (puStack_668 != (undefined8 *)0x0) {
        if ((undefined8 *)*puStack_668 != puStack_668 + 2) {
          operator_delete((undefined8 *)*puStack_668);
        }
        operator_delete(puVar3);
      }
      std::ifstream::~ifstream(local_630);
    }
    else {
      testing::Message::Message((Message *)&local_678);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (local_630,(internal *)&local_670,(AssertionResult *)"!!ofs","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_660,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/yanyiwu[P]limonp/test/unittest/TStdExtension.cpp"
                 ,0x12,local_630[0]._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_660,(Message *)&local_678);
      testing::internal::AssertHelper::~AssertHelper(&local_660);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_630[0]._M_dataplus._M_p != &local_630[0].field_2) {
        operator_delete(local_630[0]._M_dataplus._M_p);
      }
      if (local_678._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_678._M_head_impl + 8))();
      }
      puVar3 = puStack_668;
      if (puStack_668 != (undefined8 *)0x0) {
        if ((undefined8 *)*puStack_668 != puStack_668 + 2) {
          operator_delete((undefined8 *)*puStack_668);
        }
        operator_delete(puVar3);
      }
    }
    local_428._M_head_impl = _VTT;
    *(undefined8 *)(local_420 + *(long *)(_VTT + -0x18) + -8) = ___throw_bad_array_new_length;
    std::filebuf::~filebuf(local_420);
    std::ios_base::~ios_base(local_330);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_650._M_dataplus._M_p != paVar1) {
    operator_delete(local_650._M_dataplus._M_p);
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

TEST(StdOutbound, Test1) {
  ifstream ifs("../test/testdata/StdExtension.data");
  string s;
  s << ifs;
  ASSERT_EQ("key1 = val1\n##this is comment\nkey2=val2\n", s);

  const char * outFileName = "stdoutbuond.test.tmp";
  ofstream ofs(outFileName);
  s = outFileName;
  ofs << s;
  ASSERT_TRUE(!!ofs);
  ofs.close();

  ifstream ifs2(outFileName);
  s << ifs2;
  ASSERT_EQ(outFileName, s);
}